

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

void __thiscall
despot::FullChainBelief::FullChainBelief
          (FullChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions,double alpha)

{
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  long lVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  allocator_type local_7d;
  uint local_7c;
  vector<double,_std::allocator<double>_> local_78;
  FullChainBelief *local_58;
  ulong local_50;
  size_type local_48;
  ulong local_40;
  double local_38;
  
  local_7c = num_mdp_actions;
  local_38 = alpha;
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__FullChainBelief_0010ea50;
  this_00 = &this->alpha_;
  (this->alpha_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_58 = this;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)num_mdp_states);
  if (0 < num_mdp_states) {
    local_48 = (size_type)(int)local_7c;
    local_50 = (ulong)(uint)num_mdp_states;
    uVar4 = (ulong)local_7c;
    uVar5 = 0;
    do {
      local_40 = uVar5;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((this_00->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar5,local_48);
      if (0 < (int)local_7c) {
        lVar6 = 0;
        do {
          std::vector<double,_std::allocator<double>_>::vector
                    (&local_78,(long)num_mdp_states,&local_38,&local_7d);
          lVar1 = *(long *)&(this_00->
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar5].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data;
          pvVar2 = *(void **)(lVar1 + lVar6);
          lVar3 = *(long *)(lVar1 + 0x10 + lVar6);
          *(undefined8 *)(lVar1 + lVar6) =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          ((undefined8 *)(lVar1 + lVar6))[1] =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)(lVar1 + 0x10 + lVar6) =
               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,lVar3 - (long)pvVar2);
            if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          lVar6 = lVar6 + 0x18;
        } while (uVar4 * 0x18 != lVar6);
      }
      uVar5 = local_40 + 1;
    } while (uVar5 != local_50);
  }
  return;
}

Assistant:

FullChainBelief::FullChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions, double alpha) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_states);
	for (int s = 0; s < num_mdp_states; s++) {
		alpha_[s].resize(num_mdp_actions);
		for (int a = 0; a < num_mdp_actions; a++) {
			alpha_[s][a] = vector<double>(num_mdp_states, alpha);
		}
	}
}